

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_obj_motion.cxx
# Opt level: O3

void __thiscall xray_re::xr_obj_motion::create_envelopes(xr_obj_motion *this)

{
  xr_envelope *pxVar1;
  long lVar2;
  
  lVar2 = 0xd;
  do {
    pxVar1 = (xr_envelope *)operator_new(0x28);
    pxVar1->_vptr_xr_envelope = (_func_int **)&PTR__xr_envelope_00249818;
    (pxVar1->m_keys).super__Vector_base<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pxVar1->m_keys).super__Vector_base<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pxVar1->m_keys).super__Vector_base<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pxVar1->m_behaviour0 = '\x01';
    pxVar1->m_behaviour1 = '\x01';
    this->m_envelopes[lVar2 + -8] = pxVar1;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 7);
  return;
}

Assistant:

void xr_obj_motion::create_envelopes()
{
	for (uint_fast32_t i = 6; i != 0;)
		m_envelopes[--i] = new xr_envelope;
}